

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::session_impl::preemptive_unchoke(session_impl *this)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  
  iVar2 = session_settings::get_int(&this->m_settings,0x401f);
  if (iVar2 == 0) {
    iVar3 = counters::operator[](&this->m_stats_counters,0xeb);
    iVar4 = counters::operator[](&this->m_stats_counters,0xfd);
    bVar1 = true;
    if (iVar4 <= iVar3) {
      iVar2 = session_settings::get_int(&this->m_settings,0x4053);
      bVar1 = SUB41((uint)iVar2 >> 0x1f,0);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool session_impl::preemptive_unchoke() const
	{
		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker) return false;
		return m_stats_counters[counters::num_peers_up_unchoked]
			< m_stats_counters[counters::num_unchoke_slots]
			|| m_settings.get_int(settings_pack::unchoke_slots_limit) < 0;
	}